

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.cpp
# Opt level: O3

bool __thiscall libchars::history::search_next(history *this)

{
  history *phVar1;
  string *psVar2;
  int iVar3;
  history *phVar4;
  
  if (this[8] == (history)0x1) {
    phVar1 = this + 0x30;
    if (((*(history **)(this + 0x30) != phVar1) && (this[0x50] == (history)0x0)) &&
       (phVar4 = *(history **)(this + 0x48), phVar4 != phVar1)) {
      do {
        phVar4 = *(history **)phVar4;
        *(history **)(this + 0x48) = phVar4;
        if (phVar4 != phVar1) {
          psVar2 = *(string **)(this + 0x58);
          if (psVar2 == (string *)0x0) {
            return true;
          }
          if (psVar2 <= *(string **)(phVar4 + 0x18)) {
            iVar3 = std::__cxx11::string::compare
                              ((ulong)(this + 0x10),0,psVar2,(ulong)(phVar4 + 0x10),0);
            if (iVar3 == 0) {
              return true;
            }
            phVar4 = *(history **)(this + 0x48);
          }
        }
      } while (phVar4 != phVar1);
      this[8] = (history)0x0;
      this[0x50] = (history)0x1;
      return true;
    }
    this[8] = (history)0x0;
  }
  return false;
}

Assistant:

bool history::search_next()
    {
        if (!busy)
            return false;

        if (lines.empty() || overflow || li == lines.end()) {
            busy = false;
            return false;
        }

        while (li != lines.end()) {
            if (++li != lines.end()) {
                const std::string& lis = *li;
                if (s_idx == 0 || (lis.length() >= s_idx && line_tmp.compare(0,s_idx,lis,0,s_idx) == 0))
                    return true;
            }
        }

        // revert back to temporary string
        busy = false;
        overflow = true;
        return true;
    }